

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

optional<unsigned_int> __thiscall ArgsManager::GetArgFlags(ArgsManager *this,string *name)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  p_Var2 = (this->m_available_args)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar4 = 0;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_available_args)._M_t._M_impl.super__Rb_tree_header) {
      uVar3 = 0;
LAB_0033a636:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)(uVar3 | uVar4);
    }
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
                    *)&p_Var2[1]._M_parent,name);
    if (cVar1._M_node != (_Base_ptr)&p_Var2[1]._M_left) {
      uVar4 = (ulong)cVar1._M_node[4]._M_color;
      uVar3 = 0x100000000;
      goto LAB_0033a636;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
  } while( true );
}

Assistant:

std::optional<unsigned int> ArgsManager::GetArgFlags(const std::string& name) const
{
    LOCK(cs_args);
    for (const auto& arg_map : m_available_args) {
        const auto search = arg_map.second.find(name);
        if (search != arg_map.second.end()) {
            return search->second.m_flags;
        }
    }
    return std::nullopt;
}